

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

void __thiscall
CoreML::ShapeConstraint::updateSequenceRange(ShapeConstraint *this,ShapeRange *other)

{
  string err;
  ShapeRange local_80 [3];
  
  ShapeRange::intersect(local_80,&this->_sequenceRange,other);
  (this->_sequenceRange)._maximum._isUnbound = local_80[0]._maximum._isUnbound;
  *(undefined7 *)&(this->_sequenceRange)._maximum.field_0x1 = local_80[0]._maximum._1_7_;
  (this->_sequenceRange)._maximum._val = local_80[0]._maximum._val;
  (this->_sequenceRange)._minimum._isUnbound = local_80[0]._minimum._isUnbound;
  *(undefined7 *)&(this->_sequenceRange)._minimum.field_0x1 = local_80[0]._minimum._1_7_;
  (this->_sequenceRange)._minimum._val = local_80[0]._minimum._val;
  return;
}

Assistant:

void ShapeConstraint::updateSequenceRange(const ShapeRange& other) {
    try {
        _sequenceRange = _sequenceRange.intersect(other);
    }
    catch (std::runtime_error& e) {
        std::string err = "Invalid sequence range in blob " + _name + ". " + e.what();
        throw std::runtime_error(err);
    }
}